

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

uint32_t mp_sizeof_binl(uint32_t len)

{
  uint32_t uVar1;
  
  uVar1 = 2;
  if (0xff < len) {
    uVar1 = (0xffff < len) + 3 + (uint)(0xffff < len);
  }
  return uVar1;
}

Assistant:

MP_IMPL uint32_t
mp_sizeof_binl(uint32_t len)
{
	if (len <= UINT8_MAX) {
		return 1 + sizeof(uint8_t);
	} else if (len <= UINT16_MAX) {
		return 1 + sizeof(uint16_t);
	} else {
		return 1 + sizeof(uint32_t);
	}
}